

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

void nifti_mat44_to_orientation(mat44 R,int *icod,int *jcod,int *kcod)

{
  mat33 R_00;
  mat33 R_01;
  mat33 A;
  mat33 B;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  undefined4 in_stack_fffffffffffffe8c;
  float in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffeb4;
  undefined1 local_11c [36];
  float local_f8;
  int local_f4;
  float vbest;
  int rbest;
  int qbest;
  int pbest;
  int kbest;
  int jbest;
  int ibest;
  int r;
  int q;
  int p;
  int k;
  int j;
  int i;
  mat33 M;
  mat33 Q;
  mat33 P;
  float detP;
  float detQ;
  float val;
  float zk;
  float zj;
  float zi;
  float yk;
  float yj;
  float yi;
  float xk;
  float xj;
  float xi;
  int *kcod_local;
  int *jcod_local;
  int *icod_local;
  
  q = 0;
  if (((icod != (int *)0x0) && (jcod != (int *)0x0)) && (kcod != (int *)0x0)) {
    *kcod = 0;
    *jcod = 0;
    *icod = 0;
    dVar8 = sqrt((double)(R.m[2][0] * R.m[2][0] + R.m[0][0] * R.m[0][0] + R.m[1][0] * R.m[1][0]));
    fVar1 = (float)dVar8;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      fVar2 = R.m[0][0] / fVar1;
      fVar3 = R.m[1][0] / fVar1;
      fVar1 = R.m[2][0] / fVar1;
      dVar8 = sqrt((double)(R.m[2][1] * R.m[2][1] + R.m[0][1] * R.m[0][1] + R.m[1][1] * R.m[1][1]));
      fVar4 = (float)dVar8;
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        yi = R.m[0][1] / fVar4;
        zi = R.m[1][1] / fVar4;
        val = R.m[2][1] / fVar4;
        fVar4 = fVar1 * val + fVar2 * yi + fVar3 * zi;
        if (0.0001 < ABS(fVar4)) {
          fVar5 = -fVar4 * fVar2 + yi;
          fVar6 = -fVar4 * fVar3 + zi;
          fVar4 = -fVar4 * fVar1 + val;
          dVar8 = sqrt((double)(fVar4 * fVar4 + fVar5 * fVar5 + fVar6 * fVar6));
          fVar7 = (float)dVar8;
          if ((fVar7 == 0.0) && (!NAN(fVar7))) {
            return;
          }
          yi = fVar5 / fVar7;
          zi = fVar6 / fVar7;
          val = fVar4 / fVar7;
        }
        dVar8 = sqrt((double)(R.m[2][2] * R.m[2][2] + R.m[0][2] * R.m[0][2] + R.m[1][2] * R.m[1][2])
                    );
        fVar4 = (float)dVar8;
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          yj = R.m[0][2] / fVar4;
          zj = R.m[1][2] / fVar4;
          detQ = R.m[2][2] / fVar4;
        }
        else {
          yj = fVar3 * val + -(fVar1 * zi);
          zj = fVar1 * yi + -(val * fVar2);
          detQ = fVar2 * zi + -(fVar3 * yi);
        }
        fVar4 = fVar1 * detQ + fVar2 * yj + fVar3 * zj;
        if (0.0001 < ABS(fVar4)) {
          fVar5 = -fVar4 * fVar2 + yj;
          fVar6 = -fVar4 * fVar3 + zj;
          fVar4 = -fVar4 * fVar1 + detQ;
          dVar8 = sqrt((double)(fVar4 * fVar4 + fVar5 * fVar5 + fVar6 * fVar6));
          fVar7 = (float)dVar8;
          if ((fVar7 == 0.0) && (!NAN(fVar7))) {
            return;
          }
          yj = fVar5 / fVar7;
          zj = fVar6 / fVar7;
          detQ = fVar4 / fVar7;
        }
        fVar4 = val * detQ + yi * yj + zi * zj;
        if (0.0001 < ABS(fVar4)) {
          fVar5 = -fVar4 * yi + yj;
          fVar6 = -fVar4 * zi + zj;
          fVar4 = -fVar4 * val + detQ;
          dVar8 = sqrt((double)(fVar4 * fVar4 + fVar5 * fVar5 + fVar6 * fVar6));
          fVar7 = (float)dVar8;
          if ((fVar7 == 0.0) && (!NAN(fVar7))) {
            return;
          }
          yj = fVar5 / fVar7;
          zj = fVar6 / fVar7;
          detQ = fVar4 / fVar7;
        }
        M.m[2][2] = yi;
        Q.m[0][0] = yj;
        Q.m[0][2] = zi;
        Q.m[1][0] = zj;
        Q.m[1][2] = val;
        Q.m[2][0] = detQ;
        R_00.m[0][1] = fVar3;
        R_00.m[0][0] = yj;
        R_00.m[1][0] = zj;
        R_00.m[0][2] = zi;
        R_00.m[1][2] = val;
        R_00.m[1][1] = fVar1;
        R_00.m[2][0] = detQ;
        R_00.m[2][1] = (float)in_stack_fffffffffffffe8c;
        R_00.m[2][2] = in_stack_fffffffffffffe90;
        M.m[2][1] = fVar2;
        Q.m[0][1] = fVar3;
        Q.m[1][1] = fVar1;
        fVar1 = nifti_mat33_determ(R_00);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          local_f8 = -666.0;
          local_f4 = 1;
          vbest = 1.4013e-45;
          rbest = 1;
          kbest = 1;
          pbest = 2;
          qbest = 3;
          for (k = 1; k < 4; k = k + 1) {
            for (p = 1; p < 4; p = p + 1) {
              if (k != p) {
                for (q = 1; q < 4; q = q + 1) {
                  if ((k != q) && (p != q)) {
                    P.m[2][0] = 0.0;
                    P.m[1][2] = 0.0;
                    P.m[1][1] = 0.0;
                    P.m[1][0] = 0.0;
                    P.m[0][2] = 0.0;
                    P.m[0][1] = 0.0;
                    P.m[0][0] = 0.0;
                    Q.m[2][2] = 0.0;
                    for (r = -1; r < 2; r = r + 2) {
                      for (ibest = -1; ibest < 2; ibest = ibest + 2) {
                        for (jbest = -1; jbest < 2; jbest = jbest + 2) {
                          Q.m[2][(long)(k + -1) + 2] = (float)r;
                          P.m[0][(long)(p + -1) + 1] = (float)ibest;
                          P.m[1][(long)(q + -1) + 1] = (float)jbest;
                          R_01.m[0][1] = P.m[0][1];
                          R_01.m[0][0] = P.m[0][0];
                          R_01.m[1][0] = P.m[1][0];
                          R_01.m[0][2] = P.m[0][2];
                          R_01.m[1][2] = P.m[1][2];
                          R_01.m[1][1] = P.m[1][1];
                          R_01.m[2][0] = P.m[2][0];
                          R_01.m[2][1] = (float)in_stack_fffffffffffffe8c;
                          R_01.m[2][2] = in_stack_fffffffffffffe90;
                          P.m[2][2] = nifti_mat33_determ(R_01);
                          if (0.0 < P.m[2][2] * fVar1) {
                            B.m[0][1] = Q.m[0][1];
                            B.m[0][0] = Q.m[0][0];
                            B.m[1][0] = Q.m[1][0];
                            B.m[0][2] = Q.m[0][2];
                            B.m[1][2] = Q.m[1][2];
                            B.m[1][1] = Q.m[1][1];
                            A.m[0][1] = P.m[0][1];
                            A.m[0][0] = P.m[0][0];
                            A.m[1][0] = P.m[1][0];
                            A.m[0][2] = P.m[0][2];
                            A.m[1][2] = P.m[1][2];
                            A.m[1][1] = P.m[1][1];
                            A.m[2][0] = P.m[2][0];
                            A.m[2][1] = (float)in_stack_fffffffffffffe8c;
                            A.m[2][2] = M.m[2][1];
                            B.m[2][0] = Q.m[2][0];
                            B.m[2][1] = (float)(int)in_stack_fffffffffffffeb4;
                            B.m[2][2] = (float)(int)((ulong)in_stack_fffffffffffffeb4 >> 0x20);
                            in_stack_fffffffffffffe90 = M.m[2][1];
                            nifti_mat33_mul(A,B);
                            memcpy(&j,local_11c,0x24);
                            fVar2 = (float)j + M.m[0][2] + M.m[2][0];
                            if (local_f8 < fVar2) {
                              kbest = k;
                              pbest = p;
                              qbest = q;
                              rbest = r;
                              vbest = (float)ibest;
                              local_f4 = jbest;
                              local_f8 = fVar2;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          switch(kbest * rbest) {
          case 1:
            k = 1;
            break;
          case 2:
            k = 3;
            break;
          case 3:
            k = 5;
            break;
          case -3:
            k = 6;
            break;
          case -2:
            k = 4;
            break;
          case -1:
            k = 2;
          }
          switch(pbest * (int)vbest) {
          case 1:
            p = 1;
            break;
          case 2:
            p = 3;
            break;
          case 3:
            p = 5;
            break;
          case -3:
            p = 6;
            break;
          case -2:
            p = 4;
            break;
          case -1:
            p = 2;
          }
          switch(qbest * local_f4) {
          case 1:
            q = 1;
            break;
          case 2:
            q = 3;
            break;
          case 3:
            q = 5;
            break;
          case -3:
            q = 6;
            break;
          case -2:
            q = 4;
            break;
          case -1:
            q = 2;
          }
          *icod = k;
          *jcod = p;
          *kcod = q;
        }
      }
    }
  }
  return;
}

Assistant:

void nifti_mat44_to_orientation( mat44 R , int *icod, int *jcod, int *kcod )
{
   float xi,xj,xk , yi,yj,yk , zi,zj,zk , val,detQ,detP ;
   mat33 P , Q , M ;
   int i,j,k=0,p,q,r , ibest,jbest,kbest,pbest,qbest,rbest ;
   float vbest ;

   if( icod == NULL || jcod == NULL || kcod == NULL ) return ; /* bad */

   *icod = *jcod = *kcod = 0 ; /* error returns, if sh*t happens */

   /* load column vectors for each (i,j,k) direction from matrix */

   /*-- i axis --*/ /*-- j axis --*/ /*-- k axis --*/

   xi = R.m[0][0] ; xj = R.m[0][1] ; xk = R.m[0][2] ;
   yi = R.m[1][0] ; yj = R.m[1][1] ; yk = R.m[1][2] ;
   zi = R.m[2][0] ; zj = R.m[2][1] ; zk = R.m[2][2] ;

   /* normalize column vectors to get unit vectors along each ijk-axis */

   /* normalize i axis */

   val = (float)sqrt( xi*xi + yi*yi + zi*zi ) ;
   if( val == 0.0 ) return ;                 /* stupid input */
   xi /= val ; yi /= val ; zi /= val ;

   /* normalize j axis */

   val = (float)sqrt( xj*xj + yj*yj + zj*zj ) ;
   if( val == 0.0 ) return ;                 /* stupid input */
   xj /= val ; yj /= val ; zj /= val ;

   /* orthogonalize j axis to i axis, if needed */

   val = xi*xj + yi*yj + zi*zj ;    /* dot product between i and j */
   if( fabs(val) > 1.e-4 ){
     xj -= val*xi ; yj -= val*yi ; zj -= val*zi ;
     val = (float)sqrt( xj*xj + yj*yj + zj*zj ) ;  /* must renormalize */
     if( val == 0.0 ) return ;              /* j was parallel to i? */
     xj /= val ; yj /= val ; zj /= val ;
   }

   /* normalize k axis; if it is zero, make it the cross product i x j */

   val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
   if( val == 0.0 ){ xk = yi*zj-zi*yj; yk = zi*xj-zj*xi ; zk=xi*yj-yi*xj ; }
   else            { xk /= val ; yk /= val ; zk /= val ; }

   /* orthogonalize k to i */

   val = xi*xk + yi*yk + zi*zk ;    /* dot product between i and k */
   if( fabs(val) > 1.e-4 ){
     xk -= val*xi ; yk -= val*yi ; zk -= val*zi ;
     val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
     if( val == 0.0 ) return ;      /* bad */
     xk /= val ; yk /= val ; zk /= val ;
   }

   /* orthogonalize k to j */

   val = xj*xk + yj*yk + zj*zk ;    /* dot product between j and k */
   if( fabs(val) > 1.e-4 ){
     xk -= val*xj ; yk -= val*yj ; zk -= val*zj ;
     val = (float)sqrt( xk*xk + yk*yk + zk*zk ) ;
     if( val == 0.0 ) return ;      /* bad */
     xk /= val ; yk /= val ; zk /= val ;
   }

   Q.m[0][0] = xi ; Q.m[0][1] = xj ; Q.m[0][2] = xk ;
   Q.m[1][0] = yi ; Q.m[1][1] = yj ; Q.m[1][2] = yk ;
   Q.m[2][0] = zi ; Q.m[2][1] = zj ; Q.m[2][2] = zk ;

   /* at this point, Q is the rotation matrix from the (i,j,k) to (x,y,z) axes */

   detQ = nifti_mat33_determ( Q ) ;
   if( detQ == 0.0 ) return ; /* shouldn't happen unless user is a DUFIS */

   /* Build and test all possible +1/-1 coordinate permutation matrices P;
      then find the P such that the rotation matrix M=PQ is closest to the
      identity, in the sense of M having the smallest total rotation angle. */

   /* Despite the formidable looking 6 nested loops, there are
      only 3*3*3*2*2*2 = 216 passes, which will run very quickly. */

   vbest = -666.0f ; ibest=pbest=qbest=rbest=1 ; jbest=2 ; kbest=3 ;
   for( i=1 ; i <= 3 ; i++ ){     /* i = column number to use for row #1 */
    for( j=1 ; j <= 3 ; j++ ){    /* j = column number to use for row #2 */
     if( i == j ) continue ;
      for( k=1 ; k <= 3 ; k++ ){  /* k = column number to use for row #3 */
       if( i == k || j == k ) continue ;
       P.m[0][0] = P.m[0][1] = P.m[0][2] =
        P.m[1][0] = P.m[1][1] = P.m[1][2] =
         P.m[2][0] = P.m[2][1] = P.m[2][2] = 0.0f ;
       for( p=-1 ; p <= 1 ; p+=2 ){    /* p,q,r are -1 or +1      */
        for( q=-1 ; q <= 1 ; q+=2 ){   /* and go into rows #1,2,3 */
         for( r=-1 ; r <= 1 ; r+=2 ){
           P.m[0][i-1] = p ; P.m[1][j-1] = q ; P.m[2][k-1] = r ;
           detP = nifti_mat33_determ(P) ;           /* sign of permutation */
           if( detP * detQ <= 0.0 ) continue ;  /* doesn't match sign of Q */
           M = nifti_mat33_mul(P,Q) ;

           /* angle of M rotation = 2.0*acos(0.5*sqrt(1.0+trace(M)))       */
           /* we want largest trace(M) == smallest angle == M nearest to I */

           val = M.m[0][0] + M.m[1][1] + M.m[2][2] ; /* trace */
           if( val > vbest ){
             vbest = val ;
             ibest = i ; jbest = j ; kbest = k ;
             pbest = p ; qbest = q ; rbest = r ;
           }
   }}}}}}

   /* At this point ibest is 1 or 2 or 3; pbest is -1 or +1; etc.

      The matrix P that corresponds is the best permutation approximation
      to Q-inverse; that is, P (approximately) takes (x,y,z) coordinates
      to the (i,j,k) axes.

      For example, the first row of P (which contains pbest in column ibest)
      determines the way the i axis points relative to the anatomical
      (x,y,z) axes.  If ibest is 2, then the i axis is along the y axis,
      which is direction P2A (if pbest > 0) or A2P (if pbest < 0).

      So, using ibest and pbest, we can assign the output code for
      the i axis.  Mutatis mutandis for the j and k axes, of course. */

   switch( ibest*pbest ){
     case  1: i = NIFTI_L2R ; break ;
     case -1: i = NIFTI_R2L ; break ;
     case  2: i = NIFTI_P2A ; break ;
     case -2: i = NIFTI_A2P ; break ;
     case  3: i = NIFTI_I2S ; break ;
     case -3: i = NIFTI_S2I ; break ;
   }

   switch( jbest*qbest ){
     case  1: j = NIFTI_L2R ; break ;
     case -1: j = NIFTI_R2L ; break ;
     case  2: j = NIFTI_P2A ; break ;
     case -2: j = NIFTI_A2P ; break ;
     case  3: j = NIFTI_I2S ; break ;
     case -3: j = NIFTI_S2I ; break ;
   }

   switch( kbest*rbest ){
     case  1: k = NIFTI_L2R ; break ;
     case -1: k = NIFTI_R2L ; break ;
     case  2: k = NIFTI_P2A ; break ;
     case -2: k = NIFTI_A2P ; break ;
     case  3: k = NIFTI_I2S ; break ;
     case -3: k = NIFTI_S2I ; break ;
   }

   *icod = i ; *jcod = j ; *kcod = k ; return ;
}